

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

string * __thiscall
t_cpp_generator::namespace_prefix(string *__return_storage_ptr__,t_cpp_generator *this,string *ns)

{
  pointer pcVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__," ::","");
  if (ns->_M_string_length != 0) {
    lVar2 = std::__cxx11::string::find((char *)ns,0x3a9598,0);
    if (lVar2 != -1) {
      do {
        std::__cxx11::string::substr((ulong)local_58,(ulong)ns);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
        if (local_58[0] != local_48) {
          operator_delete(local_58[0]);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::substr((ulong)local_58,(ulong)ns);
        std::__cxx11::string::operator=((string *)ns,(string *)local_58);
        if (local_58[0] != local_48) {
          operator_delete(local_58[0]);
        }
        lVar2 = std::__cxx11::string::find((char *)ns,0x3a9598,0);
      } while (lVar2 != -1);
    }
    if (ns->_M_string_length != 0) {
      pcVar1 = (ns->_M_dataplus)._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + ns->_M_string_length);
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::namespace_prefix(string ns) {
  // Always start with "::", to avoid possible name collisions with
  // other names in one of the current namespaces.
  //
  // We also need a leading space, in case the name is used inside of a
  // template parameter.  "MyTemplate<::foo::Bar>" is not valid C++,
  // since "<:" is an alternative token for "[".
  string result = " ::";

  if (ns.size() == 0) {
    return result;
  }
  string::size_type loc;
  while ((loc = ns.find(".")) != string::npos) {
    result += ns.substr(0, loc);
    result += "::";
    ns = ns.substr(loc + 1);
  }
  if (ns.size() > 0) {
    result += ns + "::";
  }
  return result;
}